

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bp.cpp
# Opt level: O2

Factor * __thiscall libDAI::BP::belief(Factor *__return_storage_ptr__,BP *this,VarSet *ns)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar3;
  undefined4 extraout_var_00;
  VarSet *this_00;
  ulong I;
  Factor local_60;
  
  if ((long)(ns->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(ns->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
            super__Vector_impl_data._M_start == 0x10) {
    (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[10])
              (__return_storage_ptr__,this);
  }
  else {
    I = 0;
    while( true ) {
      iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
      uVar3 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x48))
                        ((long *)CONCAT44(extraout_var,iVar2));
      if (uVar3 <= I) break;
      iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
      this_00 = (VarSet *)
                (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x50))
                          ((long *)CONCAT44(extraout_var_00,iVar2),I);
      bVar1 = VarSet::includes(this_00,ns);
      if (bVar1) break;
      I = I + 1;
    }
    beliefF(&local_60,this,I);
    TFactor<double>::marginal(__return_storage_ptr__,&local_60,ns,true);
    TFactor<double>::~TFactor(&local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

Factor BP::belief( const VarSet &ns ) const {
        if( ns.size() == 1 )
            return belief( *(ns.begin()) );
        else {
            size_t I;
            for( I = 0; I < grm().nrFactors(); I++ )
                if( grm().factor(I).vars() >> ns )
                    break;
            assert( I != grm().nrFactors() );
            return beliefF(I).marginal(ns);
        }
    }